

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O0

void mpp_mem_pool_put_f(char *caller,MppMemPool pool,void *p)

{
  undefined8 *puVar1;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  MppMemPoolNode *node;
  MppMemPoolImpl *impl;
  void *p_local;
  MppMemPool pool_local;
  char *caller_local;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  puVar1 = (undefined8 *)((long)p + -0x28);
  if (pool == *pool) {
    if (puVar1 == (undefined8 *)*puVar1) {
      pthread_mutex_lock((pthread_mutex_t *)((long)pool + 0x18));
      if ((mpp_mem_pool_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_mem_pool","pool %d put used:unused [%d:%d] from %s",(char *)0x0,
                   *(undefined8 *)((long)pool + 0x10),(ulong)*(uint *)((long)pool + 0x70),
                   CONCAT44(uVar2,*(undefined4 *)((long)pool + 0x74)),caller);
      }
      list_del_init((list_head *)((long)p + -0x20));
      list_add((list_head *)((long)p + -0x20),(list_head *)((long)pool + 0x60));
      *(int *)((long)pool + 0x70) = *(int *)((long)pool + 0x70) + -1;
      *(int *)((long)pool + 0x74) = *(int *)((long)pool + 0x74) + 1;
      *puVar1 = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)pool + 0x18));
    }
    else {
      _mpp_log_l(2,"mpp_mem_pool","invalid mem pool ptr %p node %p check %p\n","mpp_mem_pool_put_f",
                 p,puVar1,*puVar1);
    }
  }
  else {
    _mpp_log_l(2,"mpp_mem_pool","invalid mem pool %p check %p\n","mpp_mem_pool_put_f",pool,*pool);
  }
  return;
}

Assistant:

void mpp_mem_pool_put_f(const char *caller, MppMemPool pool, void *p)
{
    MppMemPoolImpl *impl = (MppMemPoolImpl *)pool;
    MppMemPoolNode *node = (MppMemPoolNode *)((RK_U8 *)p - sizeof(MppMemPoolNode));

    if (impl != impl->check) {
        mpp_err_f("invalid mem pool %p check %p\n", impl, impl->check);
        return ;
    }

    if (node != node->check) {
        mpp_err_f("invalid mem pool ptr %p node %p check %p\n",
                  p, node, node->check);
        return ;
    }

    pthread_mutex_lock(&impl->lock);

    mem_pool_dbg_flow("pool %d put used:unused [%d:%d] from %s", impl->size,
                      impl->used_count, impl->unused_count, caller);

    list_del_init(&node->list);
    list_add(&node->list, &impl->unused);
    impl->used_count--;
    impl->unused_count++;
    node->check = NULL;

    pthread_mutex_unlock(&impl->lock);
}